

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginChildEx(char *name,ImGuiID id,ImVec2 *size_arg,bool border,ImGuiWindowFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  byte in_CL;
  uint in_ESI;
  long in_RDI;
  uint in_R8D;
  float fVar4;
  ImVec2 window;
  ImVec2 window_00;
  ImGuiWindow *child_window;
  bool ret;
  float backup_border_size;
  char *temp_window_name;
  int auto_fit_axises;
  ImVec2 size;
  ImVec2 content_avail;
  ImGuiWindow *parent_window;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000394;
  bool *in_stack_00000398;
  char *in_stack_000003a0;
  ImVec2 *in_stack_ffffffffffffff98;
  char *local_50;
  uint local_44;
  ImGuiWindow *window_01;
  
  pIVar2 = GImGui;
  window_01 = GImGui->CurrentWindow;
  window = GetContentRegionAvail();
  window_00 = ImFloor(in_stack_ffffffffffffff98);
  fVar4 = window_00.x;
  local_44 = 0;
  if (window_00.y == 0.0) {
    local_44 = 2;
  }
  local_44 = fVar4 == 0.0 | local_44;
  if (fVar4 <= 0.0) {
    fVar4 = ImMax<float>(window.x + fVar4,4.0);
    window_00.x = fVar4;
  }
  if (window_00.y <= 0.0) {
    fVar4 = ImMax<float>(window.y + window_00.y,4.0);
    window_00.y = fVar4;
  }
  SetNextWindowSize((ImVec2 *)&stack0xffffffffffffffc0,0);
  if (in_RDI == 0) {
    ImFormatStringToTempBuffer(&local_50,(char **)0x0,"%s/%08X",window_01->Name,(ulong)in_ESI);
  }
  else {
    ImFormatStringToTempBuffer
              (&local_50,(char **)0x0,"%s/%s_%08X",window_01->Name,in_RDI,(ulong)in_ESI);
  }
  fVar4 = (pIVar2->Style).ChildBorderSize;
  if ((in_CL & 1) == 0) {
    (pIVar2->Style).ChildBorderSize = 0.0;
  }
  bVar3 = Begin(in_stack_000003a0,in_stack_00000398,in_stack_00000394);
  (pIVar2->Style).ChildBorderSize = fVar4;
  pIVar1 = pIVar2->CurrentWindow;
  pIVar1->ChildId = in_ESI;
  pIVar1->AutoFitChildAxises = (ImS8)local_44;
  if (pIVar1->BeginCount == 1) {
    (window_01->DC).CursorPos = pIVar1->Pos;
  }
  if (((pIVar2->NavActivateId == in_ESI) && ((in_R8D & 0x800000) == 0)) &&
     (((pIVar1->DC).NavLayersActiveMask != 0 || (((pIVar1->DC).NavHasScroll & 1U) != 0)))) {
    FocusWindow((ImGuiWindow *)window_00);
    NavInitWindow(window_01,window.y._3_1_);
    SetActiveID((ImGuiID)((ulong)window_01 >> 0x20),(ImGuiWindow *)window);
    pIVar2->ActiveIdSource = ImGuiInputSource_Nav;
  }
  return bVar3;
}

Assistant:

bool ImGui::BeginChildEx(const char* name, ImGuiID id, const ImVec2& size_arg, bool border, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* parent_window = g.CurrentWindow;

    flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_ChildWindow;
    flags |= (parent_window->Flags & ImGuiWindowFlags_NoMove);  // Inherit the NoMove flag

    // Size
    const ImVec2 content_avail = GetContentRegionAvail();
    ImVec2 size = ImFloor(size_arg);
    const int auto_fit_axises = ((size.x == 0.0f) ? (1 << ImGuiAxis_X) : 0x00) | ((size.y == 0.0f) ? (1 << ImGuiAxis_Y) : 0x00);
    if (size.x <= 0.0f)
        size.x = ImMax(content_avail.x + size.x, 4.0f); // Arbitrary minimum child size (0.0f causing too many issues)
    if (size.y <= 0.0f)
        size.y = ImMax(content_avail.y + size.y, 4.0f);
    SetNextWindowSize(size);

    // Build up name. If you need to append to a same child from multiple location in the ID stack, use BeginChild(ImGuiID id) with a stable value.
    const char* temp_window_name;
    if (name)
        ImFormatStringToTempBuffer(&temp_window_name, NULL, "%s/%s_%08X", parent_window->Name, name, id);
    else
        ImFormatStringToTempBuffer(&temp_window_name, NULL, "%s/%08X", parent_window->Name, id);

    const float backup_border_size = g.Style.ChildBorderSize;
    if (!border)
        g.Style.ChildBorderSize = 0.0f;
    bool ret = Begin(temp_window_name, NULL, flags);
    g.Style.ChildBorderSize = backup_border_size;

    ImGuiWindow* child_window = g.CurrentWindow;
    child_window->ChildId = id;
    child_window->AutoFitChildAxises = (ImS8)auto_fit_axises;

    // Set the cursor to handle case where the user called SetNextWindowPos()+BeginChild() manually.
    // While this is not really documented/defined, it seems that the expected thing to do.
    if (child_window->BeginCount == 1)
        parent_window->DC.CursorPos = child_window->Pos;

    // Process navigation-in immediately so NavInit can run on first frame
    if (g.NavActivateId == id && !(flags & ImGuiWindowFlags_NavFlattened) && (child_window->DC.NavLayersActiveMask != 0 || child_window->DC.NavHasScroll))
    {
        FocusWindow(child_window);
        NavInitWindow(child_window, false);
        SetActiveID(id + 1, child_window); // Steal ActiveId with another arbitrary id so that key-press won't activate child item
        g.ActiveIdSource = ImGuiInputSource_Nav;
    }
    return ret;
}